

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

optional<std::pair<CPubKey,_int>_> *
miniscript::internal::ParseKeyEnd<CPubKey,(anonymous_namespace)::KeyConverter>
          (Span<const_char> in,KeyConverter *ctx)

{
  long lVar1;
  Span<const_char> sp;
  bool bVar2;
  int iVar3;
  pair<CPubKey,_int> *__t;
  Span<const_char> *in_RCX;
  pair<CPubKey,_int> *in_RDI;
  long in_FS_OFFSET;
  int key_size;
  optional<CPubKey> key;
  optional<std::pair<CPubKey,_int>_> *in_stack_ffffffffffffff18;
  pair<CPubKey,_int> *ppVar4;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  KeyConverter *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = (size_t)in_RCX;
  sp.m_data = (char *)in_RDI;
  ppVar4 = in_RDI;
  iVar3 = FindNextChar(sp,(char)((ulong)in_RDI >> 0x18));
  if (iVar3 < 1) {
    std::optional<std::pair<CPubKey,_int>_>::optional(in_stack_ffffffffffffff18);
  }
  else {
    __t = (pair<CPubKey,_int> *)Span<const_char>::begin(in_RCX);
    Span<const_char>::begin(in_RCX);
    ::(anonymous_namespace)::KeyConverter::FromString<char_const*>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar2 = std::optional::operator_cast_to_bool((optional<CPubKey> *)in_RCX);
    if (bVar2) {
      std::optional<CPubKey>::operator*((optional<CPubKey> *)in_RCX);
      std::pair<CPubKey,_int>::pair<CPubKey,_int_&,_true>(in_RDI,&__t->first,(int *)in_RCX);
      std::optional<std::pair<CPubKey,_int>_>::optional<std::pair<CPubKey,_int>,_true>
                ((optional<std::pair<CPubKey,_int>_> *)in_RDI,__t);
    }
    else {
      std::optional<std::pair<CPubKey,_int>_>::optional
                ((optional<std::pair<CPubKey,_int>_> *)in_RCX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<std::pair<CPubKey,_int>_> *)ppVar4;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<Key, int>> ParseKeyEnd(Span<const char> in, const Ctx& ctx)
{
    int key_size = FindNextChar(in, ')');
    if (key_size < 1) return {};
    auto key = ctx.FromString(in.begin(), in.begin() + key_size);
    if (!key) return {};
    return {{std::move(*key), key_size}};
}